

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCustomCommandGenerator.cxx
# Opt level: O0

void __thiscall
cmCustomCommandGenerator::cmCustomCommandGenerator
          (cmCustomCommandGenerator *this,cmCustomCommand *cc,string *config,cmLocalGenerator *lg,
          bool transformDepfile,
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *crossConfig,
          function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *computeInternalDepfile)

{
  allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  cmDepfileFormat cVar1;
  cmLocalGenerator *this_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  pointer this_02;
  bool bVar2;
  bool bVar3;
  TargetType TVar4;
  uint uVar5;
  int iVar6;
  string *psVar7;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *pvVar8;
  size_type __n;
  cmake *cmakeInstance;
  cmListFileBacktrace *pcVar9;
  cmGeneratorTarget *commandConfig;
  reference name;
  cmGlobalGenerator *pcVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  cmDepfileFormat *pcVar11;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar12;
  ulong uVar13;
  undefined1 auVar14 [16];
  string_view input;
  string_view input_00;
  set<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_std::allocator<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_>
  *in_stack_fffffffffffffab8;
  bool local_49a;
  string *local_420;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_358;
  string local_328;
  string *local_308;
  string *build_dir;
  size_t local_2f8;
  string local_2f0;
  string *local_2d0;
  string *workingdirectory;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_298;
  string local_280;
  string local_260;
  _Optional_payload_base<cmDepfileFormat> local_240;
  value_type local_238;
  undefined1 local_218 [8];
  cmCustomCommandLine argv_1;
  cmListFileBacktrace local_1e8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
  local_1d8;
  BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
  local_1b0;
  bool local_171;
  cmGeneratorTarget *pcStack_170;
  bool cross;
  cmGeneratorTarget *gt;
  undefined1 local_160 [40];
  size_type local_138;
  cmList local_130;
  undefined1 local_118 [16];
  undefined1 local_108 [8];
  string parsed_arg;
  string *clarg;
  const_iterator __end2;
  const_iterator __begin2;
  cmCustomCommandLine *__range2;
  undefined1 local_c0 [7];
  bool useOutputConfig;
  cmCustomCommandLine argv;
  cmCustomCommandLine *cmdline;
  const_iterator __end1;
  const_iterator __begin1;
  cmCustomCommandLines *__range1;
  cmCustomCommandLines *cmdlines;
  bool distinctConfigs;
  cmGeneratorTarget *target;
  undefined1 local_60 [8];
  cmGeneratorExpression ge;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *crossConfig_local;
  bool transformDepfile_local;
  cmLocalGenerator *lg_local;
  string *config_local;
  cmCustomCommand *cc_local;
  cmCustomCommandGenerator *this_local;
  
  this->CC = cc;
  bVar2 = std::optional::operator_cast_to_bool((optional *)crossConfig);
  local_358 = config;
  if (bVar2) {
    local_358 = std::
                optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator*(crossConfig);
  }
  std::__cxx11::string::string((string *)&this->OutputConfig,(string *)local_358);
  std::__cxx11::string::string((string *)&this->CommandConfig,(string *)config);
  psVar7 = cmCustomCommand::GetTarget_abi_cxx11_(cc);
  std::__cxx11::string::string((string *)&this->Target,(string *)psVar7);
  this->LG = lg;
  bVar2 = cmCustomCommand::GetEscapeOldStyle(cc);
  this->OldStyle = bVar2;
  bVar2 = cmCustomCommand::GetEscapeAllowMakeVars(cc);
  this->MakeVars = bVar2;
  cmCustomCommandLines::cmCustomCommandLines(&this->CommandLines);
  pvVar8 = &cmCustomCommand::GetCommandLines(cc)->
            super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>;
  __n = std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::size(pvVar8);
  this_00 = (allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)((long)&ge.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                       TopEntry.
                       super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi + 3);
  std::
  allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::allocator(this_00);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::vector(&this->EmulatorsWithArguments,__n,this_00);
  std::
  allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~allocator((allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)((long)&ge.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                          TopEntry.
                          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi + 3));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->Outputs);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->Byproducts);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->Depends);
  std::__cxx11::string::string((string *)&this->WorkingDirectory);
  std::
  set<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_std::allocator<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_>
  ::set(&this->Utilities);
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(&this->ComputeInternalDepfile,computeInternalDepfile);
  cmakeInstance = cmLocalGenerator::GetCMakeInstance(lg);
  pcVar9 = cmCustomCommand::GetBacktrace(cc);
  cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)&target,pcVar9);
  cmGeneratorExpression::cmGeneratorExpression
            ((cmGeneratorExpression *)local_60,cmakeInstance,(cmListFileBacktrace *)&target);
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&target);
  commandConfig = cmLocalGenerator::FindGeneratorTargetToUse(lg,&this->Target);
  bVar2 = std::operator!=(&this->OutputConfig,&this->CommandConfig);
  pvVar8 = &cmCustomCommand::GetCommandLines(this->CC)->
            super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>;
  __end1 = std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::begin(pvVar8);
  cmdline = (cmCustomCommandLine *)
            std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::end(pvVar8);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_cmCustomCommandLine_*,_std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>_>
                                *)&cmdline);
    if (!bVar3) break;
    argv.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)__gnu_cxx::
                  __normal_iterator<const_cmCustomCommandLine_*,_std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>_>
                  ::operator*(&__end1);
    cmCustomCommandLine::cmCustomCommandLine((cmCustomCommandLine *)local_c0);
    this_02 = argv.
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    __range2._7_1_ = 0;
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)argv.
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    clarg = (string *)
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)this_02);
    while( true ) {
      bVar3 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&clarg);
      if (!bVar3) break;
      parsed_arg.field_2._8_8_ =
           __gnu_cxx::
           __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&__end2);
      auVar14 = std::__cxx11::string::operator_cast_to_basic_string_view
                          ((string *)parsed_arg.field_2._8_8_);
      input._M_len = auVar14._8_8_;
      input._M_str = local_60;
      local_118 = auVar14;
      anon_unknown.dwarf_104ada4::EvaluateSplitConfigGenex
                ((string *)local_108,auVar14._0_8_,input,(cmGeneratorExpression *)this->LG,
                 (cmLocalGenerator *)(ulong)__range2._7_1_,(bool)((char)this + '\b'),
                 &this->CommandConfig,(string *)commandConfig,(cmGeneratorTarget *)&this->Utilities,
                 in_stack_fffffffffffffab8);
      bVar3 = cmCustomCommand::GetCommandExpandLists(this->CC);
      if (bVar3) {
        gt = (cmGeneratorTarget *)local_160;
        std::__cxx11::string::string((string *)gt,(string *)local_108);
        local_160._32_8_ = local_160;
        local_138 = 1;
        init._M_len = 1;
        init._M_array = (iterator)local_160._32_8_;
        cmList::cmList(&local_130,init);
        ::cm::append<cmCustomCommandLine,_cmList,_0>((cmCustomCommandLine *)local_c0,&local_130);
        cmList::~cmList(&local_130);
        local_420 = (string *)(local_160 + 0x20);
        do {
          local_420 = local_420 + -0x20;
          std::__cxx11::string::~string(local_420);
        } while (local_420 != (string *)local_160);
      }
      else {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_c0,(value_type *)local_108);
      }
      if (bVar2) {
        __range2._7_1_ = 1;
      }
      std::__cxx11::string::~string((string *)local_108);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    bVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_c0);
    if (bVar3) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::emplace_back<>((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_c0);
    }
    else {
      this_01 = this->LG;
      name = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_c0);
      pcStack_170 = cmLocalGenerator::FindGeneratorTargetToUse(this_01,name);
      if (pcStack_170 != (cmGeneratorTarget *)0x0) {
        TVar4 = cmGeneratorTarget::GetType(pcStack_170);
        if (TVar4 == EXECUTABLE) {
          local_171 = true;
          psVar7 = cmGeneratorTarget::GetName_abi_cxx11_(pcStack_170);
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
          ::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_true>
                    (&local_1d8,psVar7,&local_171);
          pcVar9 = cmCustomCommand::GetBacktrace(cc);
          cmListFileBacktrace::cmListFileBacktrace(&local_1e8,pcVar9);
          BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
          ::BT(&local_1b0,&local_1d8,&local_1e8);
          std::
          set<BT<std::pair<std::__cxx11::string,bool>>,std::less<BT<std::pair<std::__cxx11::string,bool>>>,std::allocator<BT<std::pair<std::__cxx11::string,bool>>>>
          ::emplace<BT<std::pair<std::__cxx11::string,bool>>>
                    ((set<BT<std::pair<std::__cxx11::string,bool>>,std::less<BT<std::pair<std::__cxx11::string,bool>>>,std::allocator<BT<std::pair<std::__cxx11::string,bool>>>>
                      *)&this->Utilities,&local_1b0);
          BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
          ::~BT(&local_1b0);
          cmListFileBacktrace::~cmListFileBacktrace(&local_1e8);
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
          ::~pair(&local_1d8);
        }
      }
    }
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
              (&(this->CommandLines).
                super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>,
               (value_type *)local_c0);
    cmCustomCommandLine::~cmCustomCommandLine((cmCustomCommandLine *)local_c0);
    __gnu_cxx::
    __normal_iterator<const_cmCustomCommandLine_*,_std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>_>
    ::operator++(&__end1);
  }
  local_49a = false;
  if (transformDepfile) {
    bVar2 = std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::empty
                      (&(this->CommandLines).
                        super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>);
    local_49a = false;
    if (!bVar2) {
      cmCustomCommand::GetDepfile_abi_cxx11_(cc);
      uVar5 = std::__cxx11::string::empty();
      local_49a = false;
      if ((uVar5 & 1) == 0) {
        pcVar10 = cmLocalGenerator::GetGlobalGenerator(this->LG);
        iVar6 = (*pcVar10->_vptr_cmGlobalGenerator[0x34])();
        argv_1.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)CONCAT44(extraout_var,iVar6);
        local_49a = std::optional::operator_cast_to_bool
                              ((optional *)
                               &argv_1.
                                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
    }
  }
  if (local_49a != false) {
    cmCustomCommandLine::cmCustomCommandLine((cmCustomCommandLine *)local_218);
    psVar7 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_218,psVar7);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[3]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_218,
               (char (*) [3])"-E");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[24]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_218,
               (char (*) [24])"cmake_transform_depfile");
    pcVar10 = cmLocalGenerator::GetGlobalGenerator(this->LG);
    (*pcVar10->_vptr_cmGlobalGenerator[3])(&local_238);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_218,&local_238);
    std::__cxx11::string::~string((string *)&local_238);
    pcVar10 = cmLocalGenerator::GetGlobalGenerator(this->LG);
    local_240._M_payload._M_value = (*pcVar10->_vptr_cmGlobalGenerator[0x34])();
    local_240._4_4_ = extraout_var_00;
    pcVar11 = std::optional<cmDepfileFormat>::operator*((optional<cmDepfileFormat> *)&local_240);
    cVar1 = *pcVar11;
    if (cVar1 == GccDepfile) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[11]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_218,
                 (char (*) [11])"gccdepfile");
    }
    else if (cVar1 == MakeDepfile) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[12]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_218,
                 (char (*) [12])"makedepfile");
    }
    else if (cVar1 == MSBuildAdditionalInputs) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[24]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_218,
                 (char (*) [24])"MSBuildAdditionalInputs");
    }
    psVar7 = cmLocalGenerator::GetSourceDirectory_abi_cxx11_(this->LG);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_218,psVar7);
    psVar7 = cmLocalGenerator::GetCurrentSourceDirectory_abi_cxx11_(this->LG);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_218,psVar7);
    psVar7 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_(this->LG);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_218,psVar7);
    psVar7 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(this->LG);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_218,psVar7);
    GetFullDepfile_abi_cxx11_(&local_260,this);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_218,&local_260);
    std::__cxx11::string::~string((string *)&local_260);
    GetInternalDepfile_abi_cxx11_(&local_280,this);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_218,&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
              (&(this->CommandLines).
                super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>,
               (value_type *)local_218);
    cmCustomCommandLine::~cmCustomCommandLine((cmCustomCommandLine *)local_218);
  }
  pvVar12 = cmCustomCommand::GetOutputs_abi_cxx11_(cc);
  anon_unknown.dwarf_104ada4::EvaluateOutputs
            (&local_298,pvVar12,(cmGeneratorExpression *)local_60,this->LG,&this->OutputConfig);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->Outputs,&local_298);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_298);
  pvVar12 = cmCustomCommand::GetByproducts_abi_cxx11_(cc);
  anon_unknown.dwarf_104ada4::EvaluateOutputs
            (&local_2b0,pvVar12,(cmGeneratorExpression *)local_60,this->LG,&this->OutputConfig);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->Byproducts,&local_2b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2b0);
  pvVar12 = cmCustomCommand::GetDepends_abi_cxx11_(cc);
  anon_unknown.dwarf_104ada4::EvaluateDepends
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&workingdirectory,pvVar12,(cmGeneratorExpression *)local_60,this->LG,
             &this->OutputConfig,&this->CommandConfig);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->Depends,
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&workingdirectory);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&workingdirectory);
  local_2d0 = cmCustomCommand::GetWorkingDirectory_abi_cxx11_(this->CC);
  uVar13 = std::__cxx11::string::empty();
  if ((uVar13 & 1) == 0) {
    auVar14 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_2d0);
    input_00._M_len = auVar14._8_8_;
    build_dir = auVar14._0_8_;
    input_00._M_str = local_60;
    local_2f8 = input_00._M_len;
    anon_unknown.dwarf_104ada4::EvaluateSplitConfigGenex
              (&local_2f0,(anon_unknown_dwarf_104ada4 *)build_dir,input_00,
               (cmGeneratorExpression *)this->LG,(cmLocalGenerator *)0x1,(bool)((char)this + '\b'),
               &this->CommandConfig,(string *)commandConfig,(cmGeneratorTarget *)0x0,
               in_stack_fffffffffffffab8);
    std::__cxx11::string::operator=((string *)&this->WorkingDirectory,(string *)&local_2f0);
    std::__cxx11::string::~string((string *)&local_2f0);
    uVar13 = std::__cxx11::string::empty();
    if ((uVar13 & 1) == 0) {
      local_308 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(this->LG);
      cmsys::SystemTools::CollapseFullPath(&local_328,&this->WorkingDirectory,local_308);
      std::__cxx11::string::operator=((string *)&this->WorkingDirectory,(string *)&local_328);
      std::__cxx11::string::~string((string *)&local_328);
    }
  }
  FillEmulatorsWithArguments(this);
  cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_60);
  return;
}

Assistant:

cmCustomCommandGenerator::cmCustomCommandGenerator(
  cmCustomCommand const& cc, std::string config, cmLocalGenerator* lg,
  bool transformDepfile, cm::optional<std::string> crossConfig,
  std::function<std::string(const std::string&, const std::string&)>
    computeInternalDepfile)
  : CC(&cc)
  , OutputConfig(crossConfig ? *crossConfig : config)
  , CommandConfig(std::move(config))
  , Target(cc.GetTarget())
  , LG(lg)
  , OldStyle(cc.GetEscapeOldStyle())
  , MakeVars(cc.GetEscapeAllowMakeVars())
  , EmulatorsWithArguments(cc.GetCommandLines().size())
  , ComputeInternalDepfile(std::move(computeInternalDepfile))
{

  cmGeneratorExpression ge(*lg->GetCMakeInstance(), cc.GetBacktrace());
  cmGeneratorTarget const* target{ lg->FindGeneratorTargetToUse(
    this->Target) };

  bool const distinctConfigs = this->OutputConfig != this->CommandConfig;

  const cmCustomCommandLines& cmdlines = this->CC->GetCommandLines();
  for (cmCustomCommandLine const& cmdline : cmdlines) {
    cmCustomCommandLine argv;
    // For the command itself, we default to the COMMAND_CONFIG.
    bool useOutputConfig = false;
    for (std::string const& clarg : cmdline) {
      std::string parsed_arg = EvaluateSplitConfigGenex(
        clarg, ge, this->LG, useOutputConfig, this->OutputConfig,
        this->CommandConfig, target, &this->Utilities);
      if (this->CC->GetCommandExpandLists()) {
        cm::append(argv, cmList{ parsed_arg });
      } else {
        argv.push_back(std::move(parsed_arg));
      }

      if (distinctConfigs) {
        // For remaining arguments, we default to the OUTPUT_CONFIG.
        useOutputConfig = true;
      }
    }

    if (!argv.empty()) {
      // If the command references an executable target by name,
      // collect the target to add a target-level dependency on it.
      cmGeneratorTarget* gt = this->LG->FindGeneratorTargetToUse(argv.front());
      if (gt && gt->GetType() == cmStateEnums::EXECUTABLE) {
        // GetArgv0Location uses the command config, so use a cross-dependency.
        bool const cross = true;
        this->Utilities.emplace(BT<std::pair<std::string, bool>>(
          { gt->GetName(), cross }, cc.GetBacktrace()));
      }
    } else {
      // Later code assumes at least one entry exists, but expanding
      // lists on an empty command may have left this empty.
      // FIXME: Should we define behavior for removing empty commands?
      argv.emplace_back();
    }

    this->CommandLines.push_back(std::move(argv));
  }

  if (transformDepfile && !this->CommandLines.empty() &&
      !cc.GetDepfile().empty() &&
      this->LG->GetGlobalGenerator()->DepfileFormat()) {
    cmCustomCommandLine argv;
    argv.push_back(cmSystemTools::GetCMakeCommand());
    argv.emplace_back("-E");
    argv.emplace_back("cmake_transform_depfile");
    argv.push_back(this->LG->GetGlobalGenerator()->GetName());
    switch (*this->LG->GetGlobalGenerator()->DepfileFormat()) {
      case cmDepfileFormat::GccDepfile:
        argv.emplace_back("gccdepfile");
        break;
      case cmDepfileFormat::MakeDepfile:
        argv.emplace_back("makedepfile");
        break;
      case cmDepfileFormat::MSBuildAdditionalInputs:
        argv.emplace_back("MSBuildAdditionalInputs");
        break;
    }
    argv.push_back(this->LG->GetSourceDirectory());
    argv.push_back(this->LG->GetCurrentSourceDirectory());
    argv.push_back(this->LG->GetBinaryDirectory());
    argv.push_back(this->LG->GetCurrentBinaryDirectory());
    argv.push_back(this->GetFullDepfile());
    argv.push_back(this->GetInternalDepfile());

    this->CommandLines.push_back(std::move(argv));
  }

  this->Outputs =
    EvaluateOutputs(cc.GetOutputs(), ge, this->LG, this->OutputConfig);
  this->Byproducts =
    EvaluateOutputs(cc.GetByproducts(), ge, this->LG, this->OutputConfig);
  this->Depends = EvaluateDepends(cc.GetDepends(), ge, this->LG,
                                  this->OutputConfig, this->CommandConfig);

  const std::string& workingdirectory = this->CC->GetWorkingDirectory();
  if (!workingdirectory.empty()) {
    this->WorkingDirectory = EvaluateSplitConfigGenex(
      workingdirectory, ge, this->LG, true, this->OutputConfig,
      this->CommandConfig, target);
    // Convert working directory to a full path.
    if (!this->WorkingDirectory.empty()) {
      std::string const& build_dir = this->LG->GetCurrentBinaryDirectory();
      this->WorkingDirectory =
        cmSystemTools::CollapseFullPath(this->WorkingDirectory, build_dir);
    }
  }

  this->FillEmulatorsWithArguments();
}